

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O1

void __thiscall helics::MessageDataOperator::~MessageDataOperator(MessageDataOperator *this)

{
  _Manager_type p_Var1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageDataOperator_0055a0c8;
  p_Var1 = (this->dataFunction).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->dataFunction,(_Any_data *)&this->dataFunction,__destroy_functor);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

class HELICS_CXX_EXPORT MessageDataOperator: public FilterOperator {
  public:
    /** default constructor*/
    MessageDataOperator() = default;
    /** set the function to modify the data of the message in the constructor*/
    explicit MessageDataOperator(std::function<void(SmallBuffer&)> userDataFunction);
    /** set the function to modify the data of the message*/
    void setDataFunction(std::function<void(SmallBuffer&)> userDataFunction);

  private:
    std::function<void(SmallBuffer&)> dataFunction;  //!< the function actually doing the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
}